

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImU32 id;
  uint *puVar1;
  size_t data_size;
  
  puVar1 = ImVector<unsigned_int>::back(&this->IDStack);
  data_size = (long)str_end - (long)str;
  if (str_end == (char *)0x0) {
    data_size = 0;
  }
  id = ImHashStr(str,data_size,*puVar1);
  ImGui::KeepAliveID(id);
  return id;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
    return id;
}